

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int calc_size(adiak_datatype_t *datatype)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int local_20;
  int i;
  int bytes;
  int num_elements;
  adiak_datatype_t *datatype_local;
  
  switch(datatype->dtype) {
  case adiak_type_unset:
    datatype_local._4_4_ = -1;
    break;
  case adiak_long:
  case adiak_ulong:
  case adiak_date:
    datatype_local._4_4_ = 8;
    break;
  case adiak_int:
  case adiak_uint:
    datatype_local._4_4_ = 4;
    break;
  case adiak_double:
    datatype_local._4_4_ = 8;
    break;
  case adiak_timeval:
    datatype_local._4_4_ = 8;
    break;
  case adiak_version:
  case adiak_string:
  case adiak_catstring:
  case adiak_path:
    datatype_local._4_4_ = 8;
    break;
  case adiak_range:
  case adiak_set:
  case adiak_list:
    iVar3 = datatype->num_elements;
    iVar1 = datatype->num_ref_elements;
    iVar2 = calc_size(*datatype->subtype);
    datatype_local._4_4_ = (iVar3 + iVar1) * iVar2;
    break;
  case adiak_tuple:
    local_20 = 0;
    for (local_24 = 0; local_24 < datatype->num_subtypes; local_24 = local_24 + 1) {
      iVar3 = calc_size(datatype->subtype[local_24]);
      local_20 = iVar3 + local_20;
    }
    datatype_local._4_4_ = local_20;
    break;
  case adiak_longlong:
  case adiak_ulonglong:
    datatype_local._4_4_ = 8;
    break;
  default:
    datatype_local._4_4_ = -1;
  }
  return datatype_local._4_4_;
}

Assistant:

static int calc_size(adiak_datatype_t* datatype)
{
   switch (datatype->dtype) {
      case adiak_type_unset:
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         return sizeof(long);
      case adiak_longlong:
      case adiak_ulonglong:
         return sizeof(long long);
      case adiak_int:
      case adiak_uint:
         return sizeof(int);
      case adiak_double:
         return sizeof(double);
      case adiak_timeval:
         return sizeof(struct timeval *);
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         return sizeof(char *);
      case adiak_range:
      case adiak_set:
      case adiak_list: {
         int num_elements = datatype->num_elements + datatype->num_ref_elements;
         return (num_elements * calc_size(datatype->subtype[0]));
      }
      case adiak_tuple: {
         int bytes = 0;
         for (int i = 0; i < datatype->num_subtypes; ++i)
            bytes += calc_size(datatype->subtype[i]);
         return bytes;
      }
   }
   return -1;
}